

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_right_basics.cpp
# Opt level: O1

void test_3d_dynamic<1ul,30ul,1ul>(void)

{
  pointer ptVar1;
  undefined8 uVar2;
  ulong uVar3;
  ulong uVar4;
  vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_> data;
  value_type true_idx;
  _Head_base<1UL,_int,_false> local_6c;
  _Head_base<2UL,_int,_false> local_68;
  _Head_base<0UL,_int,_false> local_64;
  vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_> local_60;
  tuple<int,_int,_int> *local_48;
  tuple<int,_int,_int> *local_40;
  pointer local_38;
  
  local_60.
  super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>._M_impl
  .super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_60.
                         super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,1);
  local_48 = (tuple<int,_int,_int> *)CONCAT71(local_48._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0xf5,"void test_3d_dynamic() [X = 1UL, Y = 30UL, Z = 1UL]",(bool *)&local_60,
             (bool *)&local_48);
  local_60.
  super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x1;
  local_48._0_4_ = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0xf7,"void test_3d_dynamic() [X = 1UL, Y = 30UL, Z = 1UL]",(unsigned_long *)&local_60,
             (int *)&local_48);
  local_60.
  super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x1;
  local_48._0_4_ = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(1))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0xf8,"void test_3d_dynamic() [X = 1UL, Y = 30UL, Z = 1UL]",(unsigned_long *)&local_60,
             (int *)&local_48);
  local_60.
  super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x1;
  local_48 = (tuple<int,_int,_int> *)CONCAT44(local_48._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(2))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0xf9,"void test_3d_dynamic() [X = 1UL, Y = 30UL, Z = 1UL]",(unsigned_long *)&local_60,
             (int *)&local_48);
  local_60.
  super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x1e;
  local_48 = (tuple<int,_int,_int> *)0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","l[0] * l[1] * l[2]",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0xfb,"void test_3d_dynamic() [X = 1UL, Y = 30UL, Z = 1UL]",(unsigned_long *)&local_60,
             (unsigned_long *)&local_48);
  local_60.
  super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x1e;
  local_48 = (tuple<int,_int,_int> *)0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","l[0] * l[1] * l[2]",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0xfc,"void test_3d_dynamic() [X = 1UL, Y = 30UL, Z = 1UL]",(unsigned_long *)&local_60,
             (unsigned_long *)&local_48);
  std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::vector
            (&local_60,0x1e,(allocator_type *)&local_48);
  ptVar1 = local_60.
           super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_68._M_head_impl = 0;
  do {
    local_6c._M_head_impl = 0;
    do {
      local_64._M_head_impl = 0;
      do {
        local_48 = (tuple<int,_int,_int> *)
                   ((long)local_68._M_head_impl + (long)local_6c._M_head_impl);
        local_40 = local_48;
        boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                  ("(l.index(i, j, k))","true_idx",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                   ,0x108,"void test_3d_dynamic() [X = 1UL, Y = 30UL, Z = 1UL]",
                   (unsigned_long *)&local_40,(unsigned_long *)&local_48);
        local_40 = ptVar1 + (long)local_64._M_head_impl * 0x1e +
                            (long)local_6c._M_head_impl + (long)local_68._M_head_impl;
        local_38 = ptVar1 + (long)local_48;
        boost::detail::test_eq_impl<std::tuple<int,int,int>*,std::tuple<int,int,int>*>
                  ("&(dptr[l.index(i, j, k)])","&(dptr[true_idx])",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                   ,0x10a,"void test_3d_dynamic() [X = 1UL, Y = 30UL, Z = 1UL]",&local_40,&local_38)
        ;
        ptVar1[(long)local_64._M_head_impl * 0x1e +
               (long)local_6c._M_head_impl + (long)local_68._M_head_impl].
        super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>._M_head_impl =
             local_64._M_head_impl;
        ptVar1[(long)local_64._M_head_impl * 0x1e +
               (long)local_6c._M_head_impl + (long)local_68._M_head_impl].
        super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
        super__Head_base<1UL,_int,_false>._M_head_impl = local_6c._M_head_impl;
        ptVar1[(long)local_64._M_head_impl * 0x1e +
               (long)local_6c._M_head_impl + (long)local_68._M_head_impl].
        super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
        super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
             local_68._M_head_impl;
        boost::detail::test_eq_impl<int,int>
                  ("(std::get<0>(dptr[l.index(i, j, k)]))","i",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                   ,0x110,"void test_3d_dynamic() [X = 1UL, Y = 30UL, Z = 1UL]",
                   &ptVar1[(long)local_64._M_head_impl * 0x1e +
                           (long)local_6c._M_head_impl + (long)local_68._M_head_impl].
                    super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>.
                    _M_head_impl,&local_64._M_head_impl);
        boost::detail::test_eq_impl<int,int>
                  ("(std::get<1>(dptr[l.index(i, j, k)]))","j",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                   ,0x111,"void test_3d_dynamic() [X = 1UL, Y = 30UL, Z = 1UL]",
                   &ptVar1[(long)local_64._M_head_impl * 0x1e +
                           (long)local_6c._M_head_impl + (long)local_68._M_head_impl].
                    super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
                    super__Head_base<1UL,_int,_false>._M_head_impl,&local_6c._M_head_impl);
        boost::detail::test_eq_impl<int,int>
                  ("(std::get<2>(dptr[l.index(i, j, k)]))","k",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                   ,0x112,"void test_3d_dynamic() [X = 1UL, Y = 30UL, Z = 1UL]",
                   (int *)(ptVar1 + (long)local_64._M_head_impl * 0x1e +
                                    (long)local_6c._M_head_impl + (long)local_68._M_head_impl),
                   &local_68._M_head_impl);
        uVar4 = (long)local_64._M_head_impl * 0x1e +
                (long)local_68._M_head_impl + (long)local_6c._M_head_impl;
        uVar3 = ((long)local_60.
                       super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_60.
                       super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
        if (uVar3 < uVar4 || uVar3 - uVar4 == 0) {
LAB_0010cca1:
          uVar2 = std::__throw_out_of_range_fmt
                            (
                            "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                            );
          if (local_60.
              super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_60.
                            super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          _Unwind_Resume(uVar2);
        }
        boost::detail::test_eq_impl<int,int>
                  ("(std::get<0>(data.at(l.index(i, j, k))))","i",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                   ,0x115,"void test_3d_dynamic() [X = 1UL, Y = 30UL, Z = 1UL]",
                   &local_60.
                    super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar4].
                    super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>.
                    _M_head_impl,&local_64._M_head_impl);
        uVar4 = (long)local_64._M_head_impl * 0x1e +
                (long)local_68._M_head_impl + (long)local_6c._M_head_impl;
        uVar3 = ((long)local_60.
                       super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_60.
                       super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
        if (uVar3 < uVar4 || uVar3 - uVar4 == 0) goto LAB_0010cca1;
        boost::detail::test_eq_impl<int,int>
                  ("(std::get<1>(data.at(l.index(i, j, k))))","j",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                   ,0x116,"void test_3d_dynamic() [X = 1UL, Y = 30UL, Z = 1UL]",
                   &local_60.
                    super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar4].
                    super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
                    super__Head_base<1UL,_int,_false>._M_head_impl,&local_6c._M_head_impl);
        uVar4 = (long)local_64._M_head_impl * 0x1e +
                (long)local_68._M_head_impl + (long)local_6c._M_head_impl;
        uVar3 = ((long)local_60.
                       super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_60.
                       super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
        if (uVar3 < uVar4 || uVar3 - uVar4 == 0) goto LAB_0010cca1;
        boost::detail::test_eq_impl<int,int>
                  ("(std::get<2>(data.at(l.index(i, j, k))))","k",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                   ,0x117,"void test_3d_dynamic() [X = 1UL, Y = 30UL, Z = 1UL]",
                   (int *)(local_60.
                           super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar4),&local_68._M_head_impl
                  );
        local_64._M_head_impl = local_64._M_head_impl + 1;
      } while (local_64._M_head_impl == 0);
      local_6c._M_head_impl = local_6c._M_head_impl + 1;
    } while ((uint)local_6c._M_head_impl < 0x1e);
    local_68._M_head_impl = local_68._M_head_impl + 1;
    if (local_68._M_head_impl != 0) {
      if (local_60.
          super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60.
                        super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
  } while( true );
}

Assistant:

void test_3d_dynamic()
{ // {{{
    layout_mapping_right<
        dimensions<dyn, dyn, dyn>, dimensions<1, 1, 1>, dimensions<0, 0, 0>
    > const l{{X, Y, Z}};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), 1);
    BOOST_TEST_EQ((l.stride(2)), 1);

    BOOST_TEST_EQ((l.size()), l[0] * l[1] * l[2]);
    BOOST_TEST_EQ((l.span()), l[0] * l[1] * l[2]);

    vector<tuple<int, int, int> > data(l[0] * l[1] * l[2]);
    tuple<int, int, int>* dptr = data.data();

    // Set all elements to a unique value.
    for (auto k = 0; k < l[2]; ++k)
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (l[1]) * (l[2]) * (i) + (l[2]) * (j) + (k);

        BOOST_TEST_EQ((l.index(i, j, k)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j, k)]), &(dptr[true_idx])); 

        std::get<0>(dptr[l.index(i, j, k)]) = i;
        std::get<1>(dptr[l.index(i, j, k)]) = j;
        std::get<2>(dptr[l.index(i, j, k)]) = k;

        BOOST_TEST_EQ((std::get<0>(dptr[l.index(i, j, k)])), i); 
        BOOST_TEST_EQ((std::get<1>(dptr[l.index(i, j, k)])), j); 
        BOOST_TEST_EQ((std::get<2>(dptr[l.index(i, j, k)])), k); 

        // Bounds-checking.
        BOOST_TEST_EQ((std::get<0>(data.at(l.index(i, j, k)))), i); 
        BOOST_TEST_EQ((std::get<1>(data.at(l.index(i, j, k)))), j); 
        BOOST_TEST_EQ((std::get<2>(data.at(l.index(i, j, k)))), k); 
    }
}